

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O0

void __thiscall psy::C::SyntaxWriterDOTFormat::generateTokens(SyntaxWriterDOTFormat *this)

{
  SyntaxKind SVar1;
  size_type sVar2;
  SyntaxToken *pSVar3;
  ulong uVar4;
  string local_c8;
  string local_a8;
  string local_88;
  string local_58;
  undefined1 local_38 [8];
  string t;
  uint token;
  SyntaxWriterDOTFormat *this_local;
  
  t.field_2._12_4_ = 1;
  while( true ) {
    uVar4 = (ulong)(uint)t.field_2._12_4_;
    sVar2 = SyntaxTree::tokenCount((this->super_SyntaxDumper).super_SyntaxVisitor.tree_);
    if (sVar2 <= uVar4) {
      return;
    }
    pSVar3 = SyntaxTree::tokenAt((this->super_SyntaxDumper).super_SyntaxVisitor.tree_,
                                 (ulong)(uint)t.field_2._12_4_);
    SVar1 = SyntaxToken::kind(pSVar3);
    if (SVar1 == EndOfFile) break;
    std::__cxx11::string::string((string *)local_38);
    terminalId_abi_cxx11_(&local_58,this,t.field_2._12_4_);
    std::__cxx11::string::append((string *)local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::append(local_38);
    pSVar3 = SyntaxTree::tokenAt((this->super_SyntaxDumper).super_SyntaxVisitor.tree_,
                                 (ulong)(uint)t.field_2._12_4_);
    SyntaxToken::valueText_abi_cxx11_(&local_88,pSVar3);
    std::__cxx11::string::append((string *)local_38);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::append(local_38);
    if (1 < (uint)t.field_2._12_4_) {
      std::__cxx11::string::append(local_38);
      terminalId_abi_cxx11_(&local_a8,this,t.field_2._12_4_ - 1);
      std::__cxx11::string::append((string *)local_38);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::append(local_38);
      terminalId_abi_cxx11_(&local_c8,this,t.field_2._12_4_);
      std::__cxx11::string::append((string *)local_38);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::append(local_38);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->terminalShapes_,(value_type *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    t.field_2._12_4_ = t.field_2._12_4_ + 1;
  }
  return;
}

Assistant:

void SyntaxWriterDOTFormat::generateTokens() {
    for (unsigned token = 1; token < tree_->tokenCount(); ++token) {
        if (tree_->tokenAt(token).kind() == SyntaxKind::EndOfFile)
            break;

        std::string t;
        t.append(terminalId(token));
        t.append(" [shape=rect label = \"");
        t.append(tree_->tokenAt(token).valueText());
        t.append("\"]");

        if (token > 1) {
            t.append("; ");
            t.append(terminalId(token - 1));
            t.append(" -> ");
            t.append(terminalId(token));
            t.append(" [arrowhead=\"vee\" color=\"transparent\"]");
        }

        terminalShapes_.push_back(t);
    }
}